

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-make.c
# Opt level: O2

object_kind * money_kind(char *name,wchar_t value)

{
  ushort uVar1;
  wchar_t wVar2;
  money *pmVar3;
  int iVar4;
  wchar_t wVar5;
  object_kind *poVar6;
  wchar_t wVar7;
  ulong uVar8;
  money *pmVar9;
  ulong uVar10;
  
  pmVar3 = money_type;
  wVar2 = num_money_types;
  uVar1 = z_info->max_depth;
  uVar10 = 0;
  uVar8 = 0;
  pmVar9 = money_type;
  if (L'\0' < num_money_types) {
    uVar8 = (ulong)(uint)num_money_types;
  }
  do {
    if (uVar8 == uVar10) {
LAB_0019f253:
      wVar7 = (wchar_t)uVar8;
      if (wVar7 == wVar2) {
        wVar7 = (((value * 100) / (int)((uint)uVar1 * 3 + 0x1e)) * wVar2) / 100;
      }
      wVar5 = wVar2 + L'\xffffffff';
      if (wVar7 < wVar2) {
        wVar5 = wVar7;
      }
      poVar6 = lookup_kind(L'#',pmVar3[wVar5].type);
      return poVar6;
    }
    iVar4 = strcmp(name,pmVar9->name);
    if (iVar4 == 0) {
      uVar8 = uVar10 & 0xffffffff;
      goto LAB_0019f253;
    }
    uVar10 = uVar10 + 1;
    pmVar9 = pmVar9 + 1;
  } while( true );
}

Assistant:

struct object_kind *money_kind(const char *name, int value)
{
	int rank;
	/* (Roughly) the largest possible gold drop at max depth - the precise
	 * value is derivable from the calculations in make_gold(), but this is
	 * near enough */
	int max_gold_drop = 3 * z_info->max_depth + 30;

	/* Check for specified treasure variety */
	for (rank = 0; rank < num_money_types; rank++)
		if (streq(name, money_type[rank].name))
			break;

	/* Pick a treasure variety scaled by level */
	if (rank == num_money_types)
		rank = (((value * 100) / max_gold_drop) * num_money_types) / 100;

	/* Do not create illegal treasure types */
	if (rank >= num_money_types) rank = num_money_types - 1;

	return lookup_kind(TV_GOLD, money_type[rank].type);
}